

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O1

IceTImage icetVtreeCompose(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  IceTImage image;
  uint uVar9;
  int iVar10;
  node_info *info;
  IceTBoolean *pIVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  node_info *pnVar16;
  int iVar17;
  long lVar18;
  int *piVar19;
  node_info *pnVar20;
  node_info *my_info;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  IceTInt num_tiles;
  IceTInt num_proc;
  int local_bc;
  IceTBoolean *local_b8;
  IceTInt rank;
  IceTImage local_a8;
  IceTInt *local_a0;
  IceTInt tile_displayed;
  int local_94;
  IceTSparseImage local_90;
  IceTVoid *local_88;
  ulong local_80;
  IceTInt *local_78;
  int *local_70;
  int *local_68;
  IceTInt max_height;
  IceTInt max_width;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  icetGetIntegerv(2,&rank);
  icetGetIntegerv(3,&num_proc);
  icetGetIntegerv(0x10,&num_tiles);
  icetGetIntegerv(0x13,&max_width);
  icetGetIntegerv(0x14,&max_height);
  local_a0 = icetUnsafeStateGetInteger(0x1a);
  local_78 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x1b,&tile_displayed);
  uVar9 = icetSparseImageBufferSize(max_width,max_height);
  local_a8 = icetGetStateBufferImage(0x1a0,max_width,max_height);
  local_80 = (ulong)uVar9;
  local_88 = icetGetStateBuffer(0x1a1,uVar9);
  local_90 = icetGetStateBufferSparseImage(0x1a2,max_width,max_height);
  info = (node_info *)icetGetStateBuffer(0x1a3,num_proc * 0x1c);
  pIVar11 = (IceTBoolean *)icetGetStateBuffer(0x1a4,num_tiles * num_proc);
  icetGetBooleanv(0x89,pIVar11);
  if (0 < num_proc) {
    lVar12 = 0;
    do {
      info[lVar12].rank = (int)lVar12;
      info[lVar12].num_contained = 0;
      info[lVar12].tile_held = -1;
      if (0 < num_tiles) {
        lVar18 = 0;
        do {
          if (pIVar11[lVar18 + num_tiles * (int)lVar12] != '\0') {
            info[lVar12].num_contained = info[lVar12].num_contained + 1;
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 < num_tiles);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < num_proc);
  }
  local_68 = &info->tile_receiving;
  local_70 = &info[1].recv_src;
  iVar10 = -1;
  local_b8 = pIVar11;
  do {
    if (1 < num_proc) {
      uVar15 = 0;
      bVar23 = false;
      do {
        do {
          bVar5 = bVar23;
          if (info[uVar15 + 1].num_contained < info[uVar15].num_contained) {
            pnVar20 = info + uVar15;
            pnVar16 = info + uVar15 + 1;
            uStack_58._0_4_ = pnVar20->rank;
            uStack_58._4_4_ = pnVar20->num_contained;
            uVar2 = pnVar20->tile_held;
            uVar3 = pnVar20->tile_sending;
            uVar4 = pnVar20->tile_receiving;
            uStack_44._0_4_ = pnVar20->send_dest;
            uStack_44._4_4_ = pnVar20->recv_src;
            iVar1 = pnVar16->rank;
            iVar6 = pnVar16->num_contained;
            iVar7 = info[uVar15 + 1].tile_held;
            iVar8 = info[uVar15 + 1].tile_sending;
            iVar14 = info[uVar15 + 1].tile_receiving;
            iVar22 = info[uVar15 + 1].send_dest;
            iVar17 = info[uVar15 + 1].recv_src;
            pnVar20->tile_sending = info[uVar15 + 1].tile_sending;
            pnVar20->tile_receiving = iVar14;
            pnVar20->send_dest = iVar22;
            pnVar20->recv_src = iVar17;
            pnVar20->rank = iVar1;
            pnVar20->num_contained = iVar6;
            pnVar20->tile_held = iVar7;
            pnVar20->tile_sending = iVar8;
            info[uVar15 + 1].tile_sending = uVar3;
            info[uVar15 + 1].tile_receiving = uVar4;
            info[uVar15 + 1].send_dest = (undefined4)uStack_44;
            info[uVar15 + 1].recv_src = uStack_44._4_4_;
            pnVar16->rank = (undefined4)uStack_58;
            pnVar16->num_contained = uStack_58._4_4_;
            info[uVar15 + 1].tile_held = uVar2;
            info[uVar15 + 1].tile_sending = uVar3;
            bVar5 = true;
            uStack_50 = uVar2;
            local_4c = uVar3;
            uStack_48 = uVar4;
          }
          uVar15 = uVar15 + 1;
          bVar23 = bVar5;
        } while (uVar15 != num_proc - 1);
        if (num_proc < 2) break;
        uVar15 = 0;
        bVar23 = false;
      } while (bVar5);
    }
    if (0 < num_proc) {
      lVar12 = 0;
      piVar13 = local_68;
      do {
        *(undefined8 *)(piVar13 + -1) = 0xffffffffffffffff;
        lVar12 = lVar12 + 1;
        piVar13 = piVar13 + 7;
      } while (lVar12 < num_proc);
    }
    uVar15 = (ulong)(uint)num_proc;
    if (num_proc < 1) {
      bVar23 = true;
    }
    else {
      lVar12 = 0;
      iVar22 = -1;
      iVar14 = 0;
      piVar13 = local_70;
      local_94 = iVar10;
      do {
        if (info[lVar12].tile_receiving < 0) {
          pnVar20 = info + lVar12;
          iVar10 = pnVar20->tile_held;
          local_bc = iVar14;
          if ((long)iVar10 < 0) {
LAB_00116ca3:
            uVar15 = (ulong)(uint)num_tiles;
            iVar14 = local_bc;
            if (0 < num_tiles) {
              uVar21 = 0;
              pIVar11 = local_b8;
              do {
                if ((((pIVar11[uVar21 + (long)(pnVar20->rank * (int)uVar15)] != '\0') ||
                     (local_a0[uVar21] == pnVar20->rank)) && (uVar21 != (uint)pnVar20->tile_sending)
                    ) && (iVar10 = find_sender(info,num_proc,(int)lVar12,(int)uVar21,
                                               local_a0[uVar21],(int)uVar15,pIVar11),
                         pIVar11 = local_b8, iVar10 != 0)) {
                  iVar14 = 1;
                  break;
                }
                uVar21 = uVar21 + 1;
                uVar15 = (ulong)num_tiles;
                iVar14 = local_bc;
              } while ((long)uVar21 < (long)uVar15);
            }
          }
          else {
            iVar10 = find_sender(info,(int)uVar15,(int)lVar12,iVar10,local_a0[iVar10],num_tiles,
                                 local_b8);
            iVar14 = 1;
            if ((iVar10 == 0) && (iVar14 = local_bc, pnVar20->tile_sending < 0)) {
              iVar10 = pnVar20->tile_held;
              if ((pnVar20->rank != local_a0[iVar10]) && (lVar12 + 1 < (long)num_proc)) {
                iVar17 = num_proc + iVar22;
                piVar19 = piVar13;
                do {
                  if (((piVar19[-2] < 0) && ((piVar19[-4] < 0 || (piVar19[-4] == iVar10)))) &&
                     ((iVar1 = ((node_info *)(piVar19 + -6))->rank, iVar1 == local_a0[iVar10] ||
                      (local_b8[iVar1 * num_tiles + iVar10] != '\0')))) {
                    piVar19[-4] = iVar10;
                    piVar19[-2] = iVar10;
                    iVar14 = info[lVar12].rank;
                    *piVar19 = iVar14;
                    info[lVar12].tile_sending = iVar10;
                    info[lVar12].send_dest = iVar1;
                    if (info[lVar12].tile_held == iVar10) {
                      pnVar20->tile_held = -1;
                    }
                    pnVar20->num_contained = pnVar20->num_contained + -1;
                    local_b8[iVar14 * num_tiles + iVar10] = '\0';
                    local_bc = 1;
                    goto LAB_00116ca3;
                  }
                  piVar19 = piVar19 + 7;
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
            }
          }
        }
        lVar12 = lVar12 + 1;
        uVar15 = (ulong)num_proc;
        iVar22 = iVar22 + -1;
        piVar13 = piVar13 + 7;
      } while (lVar12 < (long)uVar15);
      bVar23 = iVar14 == 0;
      iVar10 = local_94;
    }
    if (0 < num_proc) {
      uVar15 = (ulong)(uint)num_proc;
      pnVar20 = info;
      do {
        if (pnVar20->rank == rank) goto LAB_00116dad;
        pnVar20 = pnVar20 + 1;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    pnVar20 = (node_info *)0x0;
LAB_00116dad:
    do_send_receive(pnVar20,iVar10,num_tiles,local_b8,local_a8,local_88,(IceTSizeType)local_80,
                    local_90);
    iVar10 = pnVar20->tile_held;
  } while (!bVar23);
  lVar18 = (long)num_proc;
  pnVar16 = info;
  lVar12 = lVar18;
  my_info = pnVar20;
  if (0 < lVar18) {
    do {
      my_info = pnVar16;
      if (pnVar16->rank == rank) break;
      lVar12 = lVar12 + -1;
      pnVar16 = pnVar16 + 1;
      my_info = pnVar20;
    } while (lVar12 != 0);
  }
  my_info->tile_sending = -1;
  my_info->tile_receiving = -1;
  uVar9 = my_info->tile_held;
  if (uVar9 != tile_displayed && -1 < (int)uVar9) {
    my_info->tile_sending = uVar9;
    my_info->send_dest = local_a0[uVar9];
    my_info->tile_held = -1;
  }
  if ((0 < num_proc && -1 < tile_displayed) && my_info->tile_held != tile_displayed) {
    lVar12 = 0;
    do {
      if (*(int *)((long)&info->tile_held + lVar12) == tile_displayed) {
        my_info->tile_receiving = tile_displayed;
        my_info->recv_src = *(int *)((long)&info->rank + lVar12);
        my_info->tile_held = tile_displayed;
        break;
      }
      lVar12 = lVar12 + 0x1c;
    } while (lVar18 * 0x1c != lVar12);
  }
  do_send_receive(my_info,iVar10,num_tiles,local_b8,local_a8,local_88,(IceTSizeType)local_80,
                  local_90);
  image.opaque_internals = local_a8.opaque_internals;
  if ((-1 < tile_displayed) && (tile_displayed != my_info->tile_held)) {
    if (local_b8[num_tiles * rank + tile_displayed] == '\0') {
      icetImageSetDimensions
                (local_a8,local_78[(ulong)(uint)(tile_displayed << 2) + 2],
                 local_78[(ulong)(uint)(tile_displayed << 2) + 3]);
      icetClearImage(image);
    }
    else {
      icetGetTileImage(tile_displayed,local_a8);
    }
  }
  return (IceTImage)local_a8.opaque_internals;
}

Assistant:

IceTImage icetVtreeCompose(void)
{
    IceTInt rank, num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *display_nodes;
    IceTInt tile_displayed;
    IceTBoolean *all_contained_tmasks;
    const IceTInt *tile_viewports;
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    struct node_info *info;
    struct node_info *my_info;
    int tile, node;
    int tiles_transfered;
    int tile_held = -1;

    icetRaiseDebug("In vtreeCompose");

  /* Get state. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

  /* Allocate buffers. */
    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image                = icetGetStateBufferImage(VTREE_IMAGE_BUFFER,
                                                   max_width, max_height);
    inSparseImageBuffer  = icetGetStateBuffer(VTREE_IN_SPARSE_IMAGE_BUFFER,
                                              sparseImageSize);
    outSparseImage       = icetGetStateBufferSparseImage(
                                                  VTREE_OUT_SPARSE_IMAGE_BUFFER,
                                                  max_width, max_height);
    info                 = icetGetStateBuffer(VTREE_INFO_BUFFER,
                                             sizeof(struct node_info)*num_proc);
    all_contained_tmasks = icetGetStateBuffer(VTREE_ALL_CONTAINED_TMASKS_BUFFER,
                                        sizeof(IceTBoolean)*num_proc*num_tiles);

    icetGetBooleanv(ICET_ALL_CONTAINED_TILES_MASKS, all_contained_tmasks);
    
  /* Initialize info array. */
    for (node = 0; node < num_proc; node++) {
        info[node].rank = node;
        info[node].tile_held = -1;        /* Id of tile image held in memory. */
        info[node].num_contained = 0;        /* # of images to be rendered. */
        for (tile = 0; tile < num_tiles; tile++) {
            if (all_contained_tmasks[node*num_tiles + tile]) {
                info[node].num_contained++;
            }
        }
    }

#define CONTAINS_TILE(nodei, tile)                                \
    (all_contained_tmasks[info[nodei].rank*num_tiles+(tile)])

    tile_held = -1;
    do {
        int recv_node;

        tiles_transfered = 0;
        sort_by_contained(info, num_proc);
        for (node = 0; node < num_proc; node++) {
            info[node].tile_sending = -1;
            info[node].tile_receiving = -1;
        }

        for (recv_node = 0; recv_node < num_proc; recv_node++) {
            struct node_info *recv_info = info + recv_node;

            if (recv_info->tile_receiving >= 0) continue;

            if (recv_info->tile_held >= 0) {
              /* This node is holding a tile.  It must either send or
                 receive this tile. */
                if (find_sender(info, num_proc, recv_node, recv_info->tile_held,
                                display_nodes[recv_info->tile_held],
                                num_tiles, all_contained_tmasks)) {
                    tiles_transfered = 1;
                    continue;
                }

              /* Could not find a match for a sender, how about someone who
                 can receive it? */
                if (   (recv_info->tile_sending < 0)
                    && (recv_info->rank != display_nodes[recv_info->tile_held])
                    && find_receiver(info, num_proc, recv_node,
                                     recv_info->tile_held,
                                     display_nodes[recv_info->tile_held],
                                     num_tiles, all_contained_tmasks) ) {
                    tiles_transfered = 1;
                } else {
                  /* Could not send or receive.  Give up. */
                    continue;
                }
            }

          /* OK.  Let's try to receive any tile that we still have. */
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (   !CONTAINS_TILE(recv_node, tile)
                        && (display_nodes[tile] != recv_info->rank) )
                    || (recv_info->tile_sending == tile) ) continue;
                if (find_sender(info, num_proc, recv_node, tile,
                                display_nodes[tile], num_tiles,
                                all_contained_tmasks)) {
                    tiles_transfered = 1;
                    break;
                }
            }
        }

      /* Now that we figured out who is sending to who, do the actual
         send and receive. */
        my_info = NULL;
        for (node = 0; node < num_proc; node++) {
            if (info[node].rank == rank) {
                my_info = info + node;
                break;
            }
        }

        do_send_receive(my_info, tile_held, num_tiles,
                        all_contained_tmasks,
                        image, inSparseImageBuffer, sparseImageSize,
                        outSparseImage);

        tile_held = my_info->tile_held;

    } while (tiles_transfered);

  /* It's possible that a composited image ended up on a processor that        */
  /* is not the display node for that image.  Do one last round of        */
  /* transfers to make sure all the tiles ended up in the right place.        */
    for (node = 0; node < num_proc; node++) {
        if (info[node].rank == rank) {
            my_info = info + node;
            break;
        }
    }
    my_info->tile_receiving = -1;
    my_info->tile_sending = -1;
    if ((my_info->tile_held >= 0) && (my_info->tile_held != tile_displayed)) {
      /* I'm holding an image that does not belong to me.  Ship it off. */
        my_info->tile_sending = my_info->tile_held;
        my_info->send_dest = display_nodes[my_info->tile_held];
        my_info->tile_held = -1;
    }
    if ((my_info->tile_held != tile_displayed) && (tile_displayed >= 0)) {
      /* Someone may be holding an image that belongs to me.  Check. */
        for (node = 0; node < num_proc; node++) {
            if (info[node].tile_held == tile_displayed) {
                my_info->tile_receiving = tile_displayed;
                my_info->recv_src = info[node].rank;
                my_info->tile_held = tile_displayed;
                break;
            }
        }
    }
    do_send_receive(my_info, tile_held,
                    num_tiles, all_contained_tmasks,
                    image, inSparseImageBuffer, sparseImageSize,
                    outSparseImage);
    tile_held = my_info->tile_held;

  /* Hacks for when "this" tile was not rendered. */
    if ((tile_displayed >= 0) && (tile_displayed != tile_held)) {
        if (all_contained_tmasks[rank*num_tiles + tile_displayed]) {
          /* Only "this" node draws "this" tile.  Because the image never */
          /* needed to be transferred, it was never rendered above.  Just */
          /* render it now.                                                  */
            icetRaiseDebug("Rendering tile to display.");
          /* This may uncessarily read a buffer if not outputing an input
             buffer */
            icetGetTileImage(tile_displayed, image);
        } else {
          /* "This" tile is blank. */
            const IceTInt *display_tile_viewport
                = tile_viewports + 4*tile_displayed;
            IceTInt display_tile_width = display_tile_viewport[2];
            IceTInt display_tile_height = display_tile_viewport[3];

            icetRaiseDebug("Returning blank image.");
            icetImageSetDimensions(
                                image, display_tile_width, display_tile_height);
            icetClearImage(image);
        }
    }

    return image;
}